

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svlogd.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  ulong uVar4;
  int local_3c;
  int local_34;
  char local_21;
  int local_20;
  uint uStack_1c;
  char ch;
  int opt;
  int i;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  progname = *argv;
  _opt = argv;
  argv_local._0_4_ = argc;
  while (local_20 = sgetoptmine((int)argv_local,_opt,"R:r:l:b:tvV"), local_20 != subgetoptdone) {
    switch(local_20) {
    case 0x52:
      replace = subgetoptarg;
      if (repl == '\0') {
        repl = '_';
      }
      break;
    case 0x56:
      strerr_warn("2.1.3",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0,(strerr *)0x0)
      ;
    case 0x3f:
      usage();
      break;
    case 0x62:
      scan_ulong(subgetoptarg,&buflen);
      if (buflen == 0) {
        buflen = 0x400;
      }
      break;
    case 0x6c:
      scan_ulong(subgetoptarg,&linemax);
      if (linemax == 0) {
        linemax = 1000;
      }
      break;
    case 0x72:
      repl = *subgetoptarg;
      if ((repl == '\0') || (subgetoptarg[1] != '\0')) {
        usage();
      }
      break;
    case 0x74:
      timestamp = timestamp + 1;
      if (3 < timestamp) {
        timestamp = 3;
      }
      break;
    case 0x76:
      verbose = verbose + 1;
    }
  }
  _opt = _opt + subgetoptind;
  dirn = (int)argv_local - subgetoptind;
  if (dirn == 0) {
    usage();
  }
  if (buflen <= linemax) {
    usage();
  }
  fdwdir = open_read(".");
  if (fdwdir == -1) {
    fatal("unable to open current working directory");
  }
  coe(fdwdir);
  dir = (logdir *)alloc(dirn * 0xf0);
  if (dir == (logdir *)0x0) {
    die_nomem();
  }
  for (uStack_1c = 0; uStack_1c < dirn; uStack_1c = uStack_1c + 1) {
    dir[(int)uStack_1c].fddir = -1;
    dir[(int)uStack_1c].fdcur = -1;
    pcVar3 = alloc((uint)buflen);
    dir[(int)uStack_1c].btmp = pcVar3;
    if (dir[(int)uStack_1c].btmp == (char *)0x0) {
      die_nomem();
    }
    dir[(int)uStack_1c].ppid = 0;
  }
  databuf = alloc((uint)buflen);
  if (databuf == (char *)0x0) {
    die_nomem();
  }
  buffer_init(&data,buffer_pread,0,databuf,(uint)buflen);
  line = alloc((uint)linemax);
  if (line == (char *)0x0) {
    die_nomem();
  }
  fndir = _opt;
  in.fd = 0;
  in.events = 1;
  ndelay_on(0);
  sig_block(sig_term);
  sig_block(sig_child);
  sig_block(sig_alarm);
  sig_block(sig_hangup);
  sig_catch(sig_term,sig_term_handler);
  sig_catch(sig_child,sig_child_handler);
  sig_catch(sig_alarm,sig_alarm_handler);
  sig_catch(sig_hangup,sig_hangup_handler);
  logdirs_reopen();
  do {
    for (linelen = 0; linelen < linemax; linelen = linelen + 1) {
      if (data.p == 0) {
        local_34 = buffer_get(&data,&local_21,1);
      }
      else {
        local_21 = data.x[data.n];
        data.p = data.p - 1;
        data.n = data.n + 1;
        local_34 = 1;
      }
      if (local_34 < 1) {
        exitasap = 1;
        break;
      }
      if ((linelen == 0) && (timestamp != 0)) {
        taia_now(&now);
        if (timestamp == 1) {
          fmt_taia(stamp,&now);
        }
        else if (timestamp == 2) {
          fmt_ptime(stamp,&now);
        }
        else if (timestamp == 3) {
          fmt_ptime_iso8601(stamp,&now);
        }
        stamp[0x19] = ' ';
        stamp[0x1a] = '\0';
      }
      if (local_21 == '\n') break;
      if (repl != '\0') {
        if ((local_21 < ' ') || ('~' < local_21)) {
          local_21 = repl;
        }
        else {
          for (uStack_1c = 0; replace[(int)uStack_1c] != '\0'; uStack_1c = uStack_1c + 1) {
            if (local_21 == replace[(int)uStack_1c]) {
              local_21 = repl;
              break;
            }
          }
        }
      }
      line[linelen] = local_21;
    }
    if ((exitasap != 0) && (data.p == 0)) {
      for (uStack_1c = 0; uStack_1c < dirn; uStack_1c = uStack_1c + 1) {
        if (dir[(int)uStack_1c].ppid != 0) {
          do {
            uVar2 = processorstop(dir + (int)uStack_1c);
          } while (uVar2 == 0);
        }
        logdir_close(dir + (int)uStack_1c);
      }
      _exit(0);
    }
    for (uStack_1c = 0; uStack_1c < dirn; uStack_1c = uStack_1c + 1) {
      if (dir[(int)uStack_1c].fddir != -1) {
        if (dir[(int)uStack_1c].inst.len != 0) {
          logmatch(dir + (int)uStack_1c);
        }
        if (dir[(int)uStack_1c].matcherr == 'e') {
          if (timestamp != 0) {
            buffer_puts(buffer_2,stamp);
          }
          if (dir[(int)uStack_1c].prefix.len != 0) {
            buffer_puts(buffer_2,dir[(int)uStack_1c].prefix.s);
          }
          buffer_put(buffer_2,line,(uint)linelen);
          if (linelen == linemax) {
            buffer_puts(buffer_2,"...");
          }
          buffer_put(buffer_2,"\n",1);
          buffer_flush(buffer_2);
        }
        if (dir[(int)uStack_1c].match == '+') {
          if (dir[(int)uStack_1c].udpaddr.sin_port != 0) {
            fdudp = socket(2,2,0);
            if ((fdudp != 0) && (iVar1 = ndelay_on(fdudp), iVar1 == -1)) {
              close(fdudp);
              fdudp = -1;
            }
            if (fdudp == -1) {
              buffer_puts(&dir[(int)uStack_1c].b,"warning: no udp socket available: ");
              if (timestamp != 0) {
                buffer_puts(&dir[(int)uStack_1c].b,stamp);
              }
              if (dir[(int)uStack_1c].prefix.len != 0) {
                buffer_puts(&dir[(int)uStack_1c].b,dir[(int)uStack_1c].prefix.s);
              }
              buffer_put(&dir[(int)uStack_1c].b,line,(uint)linelen);
              buffer_put(&dir[(int)uStack_1c].b,"\n",1);
              buffer_flush(&dir[(int)uStack_1c].b);
            }
            else {
              while (iVar1 = stralloc_copys(&sa,""), iVar1 == 0) {
                pause_nomem();
              }
              if (timestamp != 0) {
                while (iVar1 = stralloc_cats(&sa,stamp), iVar1 == 0) {
                  pause_nomem();
                }
              }
              if (dir[(int)uStack_1c].prefix.len != 0) {
                while (iVar1 = stralloc_cats(&sa,dir[(int)uStack_1c].prefix.s), iVar1 == 0) {
                  pause_nomem();
                }
              }
              while (iVar1 = stralloc_catb(&sa,line,(uint)linelen), iVar1 == 0) {
                pause_nomem();
              }
              if (linelen == linemax) {
                while (iVar1 = stralloc_cats(&sa,"..."), iVar1 == 0) {
                  pause_nomem();
                }
              }
              while (iVar1 = stralloc_append(&sa,"\n"), iVar1 == 0) {
                pause_nomem();
              }
              uVar4 = sendto(fdudp,sa.s,(ulong)sa.len,0,(sockaddr *)&dir[(int)uStack_1c].udpaddr,
                             0x10);
              if (uVar4 != sa.len) {
                buffer_puts(&dir[(int)uStack_1c].b,"warning: failure sending through udp: ");
                buffer_put(&dir[(int)uStack_1c].b,sa.s,sa.len);
                buffer_flush(&dir[(int)uStack_1c].b);
              }
              close(fdudp);
            }
          }
          if (dir[(int)uStack_1c].udponly == 0) {
            if (timestamp != 0) {
              buffer_puts(&dir[(int)uStack_1c].b,stamp);
            }
            if (dir[(int)uStack_1c].prefix.len != 0) {
              buffer_puts(&dir[(int)uStack_1c].b,dir[(int)uStack_1c].prefix.s);
            }
            buffer_put(&dir[(int)uStack_1c].b,line,(uint)linelen);
          }
        }
      }
    }
    if (linelen == linemax) {
      while( true ) {
        if (data.p == 0) {
          local_3c = buffer_get(&data,&local_21,1);
        }
        else {
          local_21 = data.x[data.n];
          data.p = data.p - 1;
          data.n = data.n + 1;
          local_3c = 1;
        }
        if (local_3c < 1) break;
        if (local_21 == '\n') goto LAB_001069f3;
        for (uStack_1c = 0; uStack_1c < dirn; uStack_1c = uStack_1c + 1) {
          if (((dir[(int)uStack_1c].fddir != -1) && (dir[(int)uStack_1c].match == '+')) &&
             (dir[(int)uStack_1c].udponly == 0)) {
            if (dir[(int)uStack_1c].b.n == dir[(int)uStack_1c].b.p) {
              buffer_put(&dir[(int)uStack_1c].b,&local_21,1);
            }
            else {
              pcVar3 = dir[(int)uStack_1c].b.x;
              uVar2 = dir[(int)uStack_1c].b.p;
              dir[(int)uStack_1c].b.p = uVar2 + 1;
              pcVar3[uVar2] = local_21;
            }
          }
        }
      }
      exitasap = 1;
    }
LAB_001069f3:
    for (uStack_1c = 0; uStack_1c < dirn; uStack_1c = uStack_1c + 1) {
      if (((dir[(int)uStack_1c].fddir != -1) && (dir[(int)uStack_1c].match == '+')) &&
         (dir[(int)uStack_1c].udponly == 0)) {
        local_21 = '\n';
        if (dir[(int)uStack_1c].b.n == dir[(int)uStack_1c].b.p) {
          buffer_put(&dir[(int)uStack_1c].b,&local_21,1);
        }
        else {
          pcVar3 = dir[(int)uStack_1c].b.x;
          uVar2 = dir[(int)uStack_1c].b.p;
          dir[(int)uStack_1c].b.p = uVar2 + 1;
          pcVar3[uVar2] = '\n';
        }
        buffer_flush(&dir[(int)uStack_1c].b);
      }
    }
  } while( true );
}

Assistant:

int main(int argc, const char **argv) {
  int i;
  int opt;

  progname =*argv;

  while ((opt =getopt(argc, argv, "R:r:l:b:tvV")) != opteof) {
    switch(opt) {
    case 'R':
      replace =optarg;
      if (! repl) repl ='_';
      break;
    case 'r':
      repl =*optarg;
      if (! repl || *(optarg +1)) usage();
      break;
    case 'l':
      scan_ulong(optarg, &linemax);
      if (linemax == 0) linemax =1000;
      break;
    case 'b':
      scan_ulong(optarg, &buflen);
      if (buflen == 0) buflen =1024;
      break;
    case 't':
      if (++timestamp > 3) timestamp =3;
      break;
    case 'v':
      ++verbose;
      break;
    case 'V': strerr_warn1(VERSION, 0);
    case '?': usage();
    }
  }
  argv +=optind;

  dirn =argc -optind;
  if (dirn <= 0) usage();
  if (buflen <= linemax) usage();
  if ((fdwdir =open_read(".")) == -1)
    fatal("unable to open current working directory");
  coe(fdwdir);
  dir =(struct logdir*)alloc(dirn *sizeof(struct logdir));
  if (! dir) die_nomem();
  for (i =0; i < dirn; ++i) {
    dir[i].fddir =-1; dir[i].fdcur =-1;
    dir[i].btmp =(char*)alloc(buflen *sizeof(char));
    if (! dir[i].btmp) die_nomem();
    dir[i].ppid =0;
  }
  databuf =(char*)alloc(buflen *sizeof(char));
  if (! databuf) die_nomem();
  buffer_init(&data, buffer_pread, 0, databuf, buflen);
  line =(char*)alloc(linemax *sizeof(char));
  if (! line) die_nomem();
  fndir =argv;
  in.fd =0;
  in.events =IOPAUSE_READ;
  ndelay_on(in.fd);

  sig_block(sig_term);
  sig_block(sig_child);
  sig_block(sig_alarm);
  sig_block(sig_hangup);
  sig_catch(sig_term, sig_term_handler);
  sig_catch(sig_child, sig_child_handler);
  sig_catch(sig_alarm, sig_alarm_handler);
  sig_catch(sig_hangup, sig_hangup_handler);

  logdirs_reopen();

  for(;;) {
    char ch;

    linelen =0;
    for (linelen =0; linelen < linemax; ++linelen) {
      if (buffer_GETC(&data, &ch) <= 0) {
        exitasap =1;
        break;
      }
      if (! linelen && timestamp) {
        taia_now(&now);
        switch (timestamp) {
        case 1: fmt_taia(stamp, &now); break;
        case 2: fmt_ptime(stamp, &now); break;
        case 3: fmt_ptime_iso8601(stamp, &now); break;
        }
        stamp[25] =' '; stamp[26] =0;
      }
      if (ch == '\n') break;
      if (repl) {
        if ((ch < 32) || (ch > 126))
          ch =repl;
        else
          for (i =0; replace[i]; ++i)
            if (ch == replace[i]) {
              ch =repl;
              break;
            }
      }
      line[linelen] =ch;
    }
    if (exitasap && ! data.p) break; /* data buffer is empty */
    for (i =0; i < dirn; ++i)
      if (dir[i].fddir != -1) {
        if (dir[i].inst.len) logmatch(&dir[i]);
        if (dir[i].matcherr == 'e') {
          if (timestamp) buffer_puts(buffer_2, stamp);
          if (dir[i].prefix.len) buffer_puts(buffer_2, dir[i].prefix.s);
          buffer_put(buffer_2, line, linelen);
          if (linelen == linemax) buffer_puts(buffer_2, "...");
          buffer_put(buffer_2, "\n", 1); buffer_flush(buffer_2);
        }
        if (dir[i].match != '+') continue;
        if (dir[i].udpaddr.sin_port != 0) {
          fdudp =socket(AF_INET, SOCK_DGRAM, 0);
          if (fdudp)
            if (ndelay_on(fdudp) == -1) {
              close(fdudp);
              fdudp =-1;
            }
          if (fdudp == -1) {
            buffer_puts(&dir[i].b, "warning: no udp socket available: ");
            if (timestamp) buffer_puts(&dir[i].b, stamp);
            if (dir[i].prefix.len) buffer_puts(&dir[i].b, dir[i].prefix.s);
            buffer_put(&dir[i].b, line, linelen);
            buffer_put(&dir[i].b, "\n", 1);
            buffer_flush(&dir[i].b);
          }
          else {
            while (! stralloc_copys(&sa, "")) pause_nomem();
            if (timestamp)
              while (! stralloc_cats(&sa, stamp)) pause_nomem();
            if (dir[i].prefix.len)
              while (! stralloc_cats(&sa, dir[i].prefix.s)) pause_nomem();
            while (! stralloc_catb(&sa, line, linelen)) pause_nomem();
            if (linelen == linemax)
              while (! stralloc_cats(&sa, "...")) pause_nomem();
            while (! stralloc_append(&sa, "\n")) pause_nomem();
            if (sendto(fdudp, sa.s, sa.len, 0,
                       (struct sockaddr *)&dir[i].udpaddr,
                       sizeof(dir[i].udpaddr)) != sa.len) {
              buffer_puts(&dir[i].b, "warning: failure sending through udp: ");
              buffer_put(&dir[i].b, sa.s, sa.len);
              buffer_flush(&dir[i].b);
            }
            close(fdudp);
          }
        }
        if (! dir[i].udponly) {
          if (timestamp) buffer_puts(&dir[i].b, stamp);
          if (dir[i].prefix.len) buffer_puts(&dir[i].b, dir[i].prefix.s);
          buffer_put(&dir[i].b, line, linelen);
        }
      }
    if (linelen == linemax)
      for (;;) {
        if (buffer_GETC(&data, &ch) <= 0) {
          exitasap =1;
          break;
        }
        if (ch == '\n') break;
        for (i =0; i < dirn; ++i)
          if (dir[i].fddir != -1) {
            if (dir[i].match != '+') continue;
            if (! dir[i].udponly) buffer_PUTC(&dir[i].b, ch);
          }
      }
    for (i =0; i < dirn; ++i)
      if (dir[i].fddir != -1) {
        if (dir[i].match != '+') continue;
        if (! dir[i].udponly) {
          ch ='\n';
          buffer_PUTC(&dir[i].b, ch);
          buffer_flush(&dir[i].b);
        }
      }
  }

  for (i =0; i < dirn; ++i) {
    if (dir[i].ppid) while (! processorstop(&dir[i]));
    logdir_close(&dir[i]);
  }
  _exit(0);
}